

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageCommand.cxx
# Opt level: O0

bool __thiscall cmCTestCoverageCommand::CheckArgumentValue(cmCTestCoverageCommand *this,string *arg)

{
  string *arg_local;
  cmCTestCoverageCommand *this_local;
  
  if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 3) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->Labels,arg);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ =
         cmCTestHandlerCommand::CheckArgumentValue(&this->super_cmCTestHandlerCommand,arg);
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestCoverageCommand::CheckArgumentValue(std::string const& arg)
{
  // Handle states specific to this command.
  if(this->ArgumentDoing == ArgumentDoingLabels)
    {
    this->Labels.insert(arg);
    return true;
    }

  // Look for other arguments.
  return this->Superclass::CheckArgumentValue(arg);
}